

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O2

void __thiscall
bssl::ParseNameConstraints_failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarily_Test::
~ParseNameConstraints_failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarily_Test
          (ParseNameConstraints_failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarily_Test *this)

{
  ~ParseNameConstraints_failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarily_Test
            ((ParseNameConstraints_failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarily_Test *)
             &this[-1].super_ParseNameConstraints.super_TestWithParam<std::tuple<bool>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ParseNameConstraints,
       failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarily) {
  std::string constraints_der;
  ASSERT_TRUE(
      LoadTestNameConstraint("dnsname-with_min_0.pem", &constraints_der));
  // The value should not be in the DER encoding if it is the default. But this
  // could be changed to allowed if there are buggy encoders out there that
  // include it anyway.
  CertErrors errors;
  EXPECT_FALSE(NameConstraints::Create(StringAsBytes(constraints_der),
                                       is_critical(), &errors));
}